

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_writeCTable(void *dst,size_t maxDstSize,HUF_CElt *CTable,U32 maxSymbolValue,U32 huffLog)

{
  uint uVar1;
  ulong uVar2;
  char *dst_00;
  ulong wtSize;
  size_t sStack_140;
  BYTE bitsToWeight [13];
  BYTE huffWeight [255];
  
  if (maxSymbolValue < 0x100) {
    bitsToWeight[0] = '\0';
    uVar1 = huffLog + 1;
    for (uVar2 = 1; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      bitsToWeight[uVar2] = (BYTE)huffLog;
      huffLog = (U32)(byte)((BYTE)huffLog - 1);
    }
    wtSize = (ulong)maxSymbolValue;
    for (uVar2 = 0; wtSize != uVar2; uVar2 = uVar2 + 1) {
      huffWeight[uVar2] = bitsToWeight[CTable[uVar2].nbBits];
    }
    dst_00 = (char *)((long)dst + 1);
    sStack_140 = HUF_compressWeights(dst_00,maxDstSize - 1,huffWeight,wtSize);
    if (sStack_140 < 0xffffffffffffff89) {
      if (sStack_140 < maxSymbolValue >> 1 && 1 < sStack_140) {
        *(char *)dst = (char)sStack_140;
        sStack_140 = sStack_140 + 1;
      }
      else if (maxSymbolValue < 0x81) {
        sStack_140 = (size_t)((maxSymbolValue + 1 >> 1) + 1);
        if (maxDstSize < sStack_140) {
          sStack_140 = 0xffffffffffffffba;
        }
        else {
          *(char *)dst = (char)maxSymbolValue + '\x7f';
          huffWeight[wtSize] = '\0';
          for (uVar2 = 0; uVar2 < wtSize; uVar2 = uVar2 + 2) {
            *dst_00 = huffWeight[uVar2] * '\x10' + huffWeight[uVar2 + 1];
            dst_00 = dst_00 + 1;
          }
        }
      }
      else {
        sStack_140 = 0xffffffffffffffff;
      }
    }
    return sStack_140;
  }
  return 0xffffffffffffffd2;
}

Assistant:

size_t HUF_writeCTable (void* dst, size_t maxDstSize,
                        const HUF_CElt* CTable, U32 maxSymbolValue, U32 huffLog)
{
    BYTE bitsToWeight[HUF_TABLELOG_MAX + 1];   /* precomputed conversion table */
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX];
    BYTE* op = (BYTE*)dst;
    U32 n;

     /* check conditions */
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);

    /* convert to weight */
    bitsToWeight[0] = 0;
    for (n=1; n<huffLog+1; n++)
        bitsToWeight[n] = (BYTE)(huffLog + 1 - n);
    for (n=0; n<maxSymbolValue; n++)
        huffWeight[n] = bitsToWeight[CTable[n].nbBits];

    /* attempt weights compression by FSE */
    {   CHECK_V_F(hSize, HUF_compressWeights(op+1, maxDstSize-1, huffWeight, maxSymbolValue) );
        if ((hSize>1) & (hSize < maxSymbolValue/2)) {   /* FSE compressed */
            op[0] = (BYTE)hSize;
            return hSize+1;
    }   }

    /* write raw values as 4-bits (max : 15) */
    if (maxSymbolValue > (256-128)) return ERROR(GENERIC);   /* should not happen : likely means source cannot be compressed */
    if (((maxSymbolValue+1)/2) + 1 > maxDstSize) return ERROR(dstSize_tooSmall);   /* not enough space within dst buffer */
    op[0] = (BYTE)(128 /*special case*/ + (maxSymbolValue-1));
    huffWeight[maxSymbolValue] = 0;   /* to be sure it doesn't cause msan issue in final combination */
    for (n=0; n<maxSymbolValue; n+=2)
        op[(n/2)+1] = (BYTE)((huffWeight[n] << 4) + huffWeight[n+1]);
    return ((maxSymbolValue+1)/2) + 1;
}